

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>
::val(FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>
      *this)

{
  FadExpr<FadBinaryMinus<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>
  *pFVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  pFVar1 = this->left_;
  dVar2 = ::exp(-((((pFVar1->fadexpr_).left_)->fadexpr_).expr_.fadexpr_.expr_)->val_);
  dVar3 = ::exp((((pFVar1->fadexpr_).right_)->fadexpr_).expr_.val_);
  dVar4 = cos((this->right_->fadexpr_).expr_.val_);
  return dVar4 * (dVar2 - dVar3);
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}